

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall
FpgaIO::ReadRTL8211F_Register(FpgaIO *this,uint chan,uint phyAddr,uint regAddr,uint16_t *data)

{
  BasePort *pBVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  void *pvVar5;
  bool bVar6;
  bool bVar7;
  uint local_4c;
  uint i;
  undefined2 uStack_40;
  bool regAddrMatch;
  bool isIdle;
  uint regAddrRead;
  quadlet_t read_data;
  uint32_t write_data;
  nodeaddr_t address;
  uint16_t *data_local;
  uint local_20;
  uint regAddr_local;
  uint phyAddr_local;
  uint chan_local;
  FpgaIO *this_local;
  
  address = (nodeaddr_t)data;
  data_local._4_4_ = regAddr;
  local_20 = phyAddr;
  regAddr_local = chan;
  _phyAddr_local = this;
  bVar2 = WaitRTL8211F_Idle(this,"ReadRTL8211F_Register",chan,0x14);
  if (bVar2) {
    _read_data = (ulong)(regAddr_local << 8 | 0x40a0);
    regAddrRead = (local_20 & 0x1f) << 0x17 | 0x60000000 | (data_local._4_4_ & 0x1f) << 0x12;
    pBVar1 = (this->super_BoardIO).port;
    uVar3 = (*pBVar1->_vptr_BasePort[0x24])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,_read_data,(ulong)regAddrRead);
    if ((uVar3 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      Amp1394_Sleep(0.001);
      bVar2 = false;
      bVar7 = false;
      local_4c = 0;
      while( true ) {
        if ((!bVar2) || (bVar6 = false, !bVar7)) {
          bVar6 = local_4c < 0x14;
          local_4c = local_4c + 1;
        }
        if (!bVar6) break;
        pBVar1 = (this->super_BoardIO).port;
        uVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_BoardIO).BoardId,_read_data,
                           &stack0xffffffffffffffc0);
        if (((uVar3 & 1) != 0) && (bVar2 = (_uStack_40 & 0x7000000) == 0, bVar2)) {
          i = (_uStack_40 & 0x1f0000) >> 0x10;
          bVar7 = i == data_local._4_4_;
        }
      }
      if (bVar2) {
        if (!bVar7) {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ReadRTL8211F_Register regAddr mismatch, expected ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar5,data_local._4_4_);
          poVar4 = std::operator<<(poVar4,", received ");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,i);
          pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::dec);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ReadRTL8211F_Register timeout waiting for data, read ");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,std::hex);
        pvVar5 = (void *)std::ostream::operator<<(pvVar5,_uStack_40);
        pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::dec);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      }
      *(undefined2 *)address = uStack_40;
      this_local._7_1_ = (bool)(bVar2 & bVar7);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::ReadRTL8211F_Register(unsigned int chan, unsigned int phyAddr, unsigned int regAddr, uint16_t &data)
{
    // Should have firmware/hardware checks
    // Wait for FPGA mdio interface to be idle
    if (!WaitRTL8211F_Idle("ReadRTL8211F_Register", chan, 20))
        return false;
    nodeaddr_t address = 0x40a0 | (chan << 8);
    // Format: 0110 PPPP PRRR RRXX X(16), where P indicates phyAddr, R indicates regAddr, X is don't care (0)
    uint32_t write_data = 0x60000000 | ((phyAddr&0x1f) << 23) | ((regAddr&0x1f) << 18);
    if (!port->WriteQuadlet(BoardId, address, write_data))
        return false;
    // Read data is not valid unless FPGA mdio interface is in idle state. For most interfaces (e.g., Firewire,
    // Ethernet), this will already be the case, but the Zynq EMIO mmap interface is fast so some waiting is needed.
    // First, wait 1 millisecond
    Amp1394_Sleep(0.001);
    // Now, loop up to 20 times until mdio interface is idle and register address matches
    quadlet_t read_data;
    unsigned int regAddrRead;
    bool isIdle = false;
    bool regAddrMatch = false;
    unsigned int i = 0;
    while (!(isIdle && regAddrMatch) && (i++ < 20)) {
        if (port->ReadQuadlet(BoardId, address, read_data)) {
            isIdle = ((read_data&0x07000000) == 0);
            if (isIdle) {
                regAddrRead = (read_data & 0x001f0000)>>16;
                regAddrMatch = (regAddrRead == regAddr);
            }
        }
    }
    if (!isIdle) {
        std::cout << "ReadRTL8211F_Register timeout waiting for data, read " << std::hex
                  << read_data << std::dec << std::endl;
    }
    else if (!regAddrMatch) {
        std::cout << "ReadRTL8211F_Register regAddr mismatch, expected " << std::hex
                  << regAddr << ", received " << regAddrRead << std::dec << std::endl;
    }
    // Set data even if error, since it could be correct and caller may not check return value
    data = static_cast<uint16_t>(read_data & 0x0000ffff);
    return (isIdle & regAddrMatch);
}